

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void Destroy_Module(FT_Module module)

{
  FT_Memory memory_00;
  FT_Module_Class *pFVar1;
  FT_Library pFVar2;
  FT_Library library;
  FT_Module_Class *clazz;
  FT_Memory memory;
  FT_Module module_local;
  
  memory_00 = module->memory;
  pFVar1 = module->clazz;
  pFVar2 = module->library;
  if ((pFVar2 != (FT_Library)0x0) && (pFVar2->auto_hinter == module)) {
    pFVar2->auto_hinter = (FT_Module)0x0;
  }
  if ((module->clazz->module_flags & 2) != 0) {
    ft_remove_renderer(module);
  }
  if ((module->clazz->module_flags & 1) != 0) {
    Destroy_Driver((FT_Driver)module);
  }
  if (pFVar1->module_done != (FT_Module_Destructor)0x0) {
    (*pFVar1->module_done)(module);
  }
  ft_mem_free(memory_00,module);
  return;
}

Assistant:

static void
  Destroy_Module( FT_Module  module )
  {
    FT_Memory         memory  = module->memory;
    FT_Module_Class*  clazz   = module->clazz;
    FT_Library        library = module->library;


    if ( library && library->auto_hinter == module )
      library->auto_hinter = NULL;

    /* if the module is a renderer */
    if ( FT_MODULE_IS_RENDERER( module ) )
      ft_remove_renderer( module );

    /* if the module is a font driver, add some steps */
    if ( FT_MODULE_IS_DRIVER( module ) )
      Destroy_Driver( FT_DRIVER( module ) );

    /* finalize the module object */
    if ( clazz->module_done )
      clazz->module_done( module );

    /* discard it */
    FT_FREE( module );
  }